

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzcompelpostproc.h
# Opt level: O3

TPZCompEl * __thiscall
TPZCompElPostProc<TPZCompElH1<pzshape::TPZShapePrism>_>::Clone
          (TPZCompElPostProc<TPZCompElH1<pzshape::TPZShapePrism>_> *this,TPZCompMesh *mesh)

{
  TPZCompElH1<pzshape::TPZShapePrism> *this_00;
  
  this_00 = (TPZCompElH1<pzshape::TPZShapePrism> *)operator_new(0x148);
  *(undefined ***)
   &(this_00->super_TPZIntelGen<pzshape::TPZShapePrism>).super_TPZInterpolatedElement.
    super_TPZInterpolationSpace.super_TPZCompEl = &PTR__TPZSavable_0197a340;
  TPZCompElH1<pzshape::TPZShapePrism>::TPZCompElH1
            (this_00,&PTR_PTR_01972130,mesh,&this->super_TPZCompElH1<pzshape::TPZShapePrism>);
  *(undefined8 *)
   &this_00[1].super_TPZIntelGen<pzshape::TPZShapePrism>.super_TPZInterpolatedElement.
    super_TPZInterpolationSpace.super_TPZCompEl = 0;
  *(undefined ***)
   &(this_00->super_TPZIntelGen<pzshape::TPZShapePrism>).super_TPZInterpolatedElement.
    super_TPZInterpolationSpace.super_TPZCompEl = &PTR__TPZCompElPostProc_01971d60;
  return (TPZCompEl *)this_00;
}

Assistant:

inline TPZCompEl * TPZCompElPostProc<TCOMPEL>::Clone(TPZCompMesh &mesh) const{
    return new TPZCompElPostProc<TCOMPEL> (mesh, *this);
}